

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

void __thiscall presolve::HPresolve::removeFixedCol(HPresolve *this,HighsInt col)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  reference pvVar5;
  uint *puVar6;
  reference pvVar7;
  int in_ESI;
  HPresolve *in_RDI;
  HighsInt in_stack_0000000c;
  HPresolve *in_stack_00000010;
  HighsInt in_stack_0000001c;
  HPresolveAnalysis *in_stack_00000020;
  HighsInt colpos;
  double colval;
  HighsInt colrow;
  HighsInt coliter;
  double fixval;
  bool logging_on;
  undefined8 in_stack_ffffffffffffffa8;
  HighsInt col_00;
  double dVar8;
  HPresolve *in_stack_ffffffffffffffb0;
  double dVar9;
  uint local_1c;
  
  col_00 = (HighsInt)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  bVar4 = (bool)((in_RDI->analysis_).logging_on_ & 1);
  if (bVar4 != false) {
    HPresolveAnalysis::startPresolveRuleLog
              ((HPresolveAnalysis *)in_stack_00000010,in_stack_0000000c);
  }
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     (&in_RDI->model->col_lower_,(long)in_ESI);
  dVar1 = *pvVar5;
  markColDeleted(in_stack_ffffffffffffffb0,col_00);
  puVar6 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->colhead,(long)in_ESI)
  ;
  local_1c = *puVar6;
  while (local_1c != 0xffffffff) {
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->Arow,(long)(int)local_1c);
    iVar2 = *pvVar7;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->Avalue,(long)(int)local_1c);
    dVar8 = *pvVar5;
    puVar6 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                               (&in_RDI->Anext,(long)(int)local_1c);
    uVar3 = *puVar6;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->model->row_lower_,(long)iVar2);
    if ((*pvVar5 != -INFINITY) || (NAN(*pvVar5))) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->model->row_lower_,(long)iVar2);
      *pvVar5 = -dVar8 * dVar1 + *pvVar5;
    }
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->model->row_upper_,(long)iVar2);
    if ((*pvVar5 != INFINITY) || (NAN(*pvVar5))) {
      dVar9 = dVar1;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->model->row_upper_,(long)iVar2);
      *pvVar5 = -dVar8 * dVar9 + *pvVar5;
    }
    unlink(in_RDI,(char *)(ulong)local_1c);
    reinsertEquation(in_stack_00000010,in_stack_0000000c);
    local_1c = uVar3;
  }
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     (&in_RDI->model->col_cost_,(long)in_ESI);
  in_RDI->model->offset_ = *pvVar5 * dVar1 + in_RDI->model->offset_;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     (&in_RDI->model->col_cost_,(long)in_ESI);
  *pvVar5 = 0.0;
  (in_RDI->analysis_).logging_on_ = bVar4;
  if (bVar4 != false) {
    HPresolveAnalysis::stopPresolveRuleLog(in_stack_00000020,in_stack_0000001c);
  }
  return;
}

Assistant:

void HPresolve::removeFixedCol(HighsInt col) {
  const bool logging_on = analysis_.logging_on_;
  if (logging_on) analysis_.startPresolveRuleLog(kPresolveRuleFixedCol);
  double fixval = model->col_lower_[col];

  markColDeleted(col);

  for (HighsInt coliter = colhead[col]; coliter != -1;) {
    HighsInt colrow = Arow[coliter];
    double colval = Avalue[coliter];
    assert(Acol[coliter] == col);

    HighsInt colpos = coliter;
    coliter = Anext[coliter];

    if (model->row_lower_[colrow] != -kHighsInf)
      model->row_lower_[colrow] -= colval * fixval;

    if (model->row_upper_[colrow] != kHighsInf)
      model->row_upper_[colrow] -= colval * fixval;

    unlink(colpos);

    reinsertEquation(colrow);
  }

  model->offset_ += model->col_cost_[col] * fixval;
  assert(std::isfinite(model->offset_));
  model->col_cost_[col] = 0;
  analysis_.logging_on_ = logging_on;
  if (logging_on) analysis_.stopPresolveRuleLog(kPresolveRuleFixedCol);
}